

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::save_load(gd *g,io_buf *model_file,bool read,bool text)

{
  float fVar1;
  vw *all;
  char cVar2;
  uint32_t uVar3;
  bool bVar4;
  pair<float,_float> *ppVar5;
  ulong i;
  float *pfVar6;
  ostream *poVar7;
  long *plVar8;
  uint32_t *puVar9;
  undefined7 in_register_00000011;
  float fVar10;
  bool resume;
  stringstream msg;
  char local_1c1;
  float local_1c0;
  float local_1bc;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  all = g->all;
  if ((int)CONCAT71(in_register_00000011,read) != 0) {
    initialize_regressor(all);
    if ((all->adaptive == true) && (fVar10 = all->initial_t, 0.0 < fVar10)) {
      fVar1 = all->initial_weight;
      if ((all->weights).sparse == true) {
        local_1c0 = fVar10;
        local_1bc = fVar1;
        ppVar5 = calloc_or_throw<std::pair<float,float>>(1);
        ppVar5->first = local_1bc;
        ppVar5->second = local_1c0;
        (all->weights).sparse_weights.default_data = ppVar5;
        (all->weights).sparse_weights.fun = set_initial_gd_wrapper<sparse_parameters>::func;
        pfVar6 = (all->weights).sparse_weights.default_value;
        *pfVar6 = ppVar5->first;
        pfVar6[1] = ppVar5->second;
      }
      else {
        pfVar6 = (all->weights).dense_weights._begin;
        if (pfVar6 != pfVar6 + (all->weights).dense_weights._weight_mask + 1) {
          uVar3 = (all->weights).dense_weights._stride_shift;
          do {
            *pfVar6 = fVar1;
            pfVar6[1] = fVar10;
            pfVar6 = pfVar6 + (1L << ((byte)uVar3 & 0x3f));
          } while (pfVar6 != (all->weights).dense_weights._begin +
                             (all->weights).dense_weights._weight_mask + 1);
        }
      }
    }
    fVar10 = g->initial_constant;
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      bVar4 = (all->weights).sparse;
      puVar9 = &(all->weights).dense_weights._stride_shift;
      if (bVar4 != false) {
        puVar9 = &(all->weights).sparse_weights._stride_shift;
      }
      i = 0xb1c55cL << ((byte)*puVar9 & 0x3f);
      if (bVar4 == true) {
        local_1c0 = fVar10;
        pfVar6 = sparse_parameters::operator[](&(all->weights).sparse_weights,i);
        fVar10 = local_1c0;
      }
      else {
        pfVar6 = (all->weights).dense_weights._begin +
                 (i & (all->weights).dense_weights._weight_mask);
      }
      *pfVar6 = fVar10;
    }
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    local_1c1 = all->save_resume;
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar7 = std::ostream::_M_insert<bool>(SUB81((ostream *)local_1a8,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,&local_1c1,1,"");
    }
    else {
      bin_text_write_fixed(model_file,&local_1c1,1,(stringstream *)local_1b8,text);
    }
    if (local_1c1 == '\x01') {
      if (read) {
        bVar4 = version_struct::operator<(&all->model_file_ver,"7.10.1");
        if (bVar4) {
          cVar2 = (char)all + -0x20;
          std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar2);
          std::ostream::put(cVar2);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "WARNING: --save_resume functionality is known to have inaccuracy in model files version less than "
                     ,0x62);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"7.10.1",6);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          plVar8 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
          std::ostream::put((char)plVar8);
          std::ostream::flush();
        }
      }
      save_load_online_state(all,model_file,read,text,g);
    }
    else {
      save_load_regressor(all,model_file,read,text);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  if (all->training == false) {
    sync_weights(all);
  }
  return;
}

Assistant:

void save_load(gd& g, io_buf& model_file, bool read, bool text)
{
  vw& all = *g.all;
  if (read)
  {
    initialize_regressor(all);

    if (all.adaptive && all.initial_t > 0)
    {
      float init_weight = all.initial_weight;
      pair<float, float> p = make_pair(init_weight, all.initial_t);
      if (all.weights.sparse)
        all.weights.sparse_weights.set_default<pair<float, float>, set_initial_gd_wrapper<sparse_parameters> >(p);
      else
        all.weights.dense_weights.set_default<pair<float, float>, set_initial_gd_wrapper<dense_parameters> >(p);
      // for adaptive update, we interpret initial_t as previously seeing initial_t fake datapoints, all with squared
      // gradient=1 NOTE: this is not invariant to the scaling of the data (i.e. when combined with normalized). Since
      // scaling the data scales the gradient, this should ideally be feature_range*initial_t, or something like that.
      // We could potentially fix this by just adding this base quantity times the current range to the sum of gradients
      // stored in memory at each update, and always start sum of gradients to 0, at the price of additional additions
      // and multiplications during the update...
    }
    if (g.initial_constant != 0.0)
      VW::set_weight(all, constant, 0, g.initial_constant);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = all.save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);
    if (resume)
    {
      if (read && all.model_file_ver < VERSION_SAVE_RESUME_FIX)
        all.trace_message
            << endl
            << "WARNING: --save_resume functionality is known to have inaccuracy in model files version less than "
            << VERSION_SAVE_RESUME_FIX << endl
            << endl;
      // save_load_online_state(g, model_file, read, text);
      save_load_online_state(all, model_file, read, text, &g);
    }
    else
      save_load_regressor(all, model_file, read, text);
  }
  if (!all.training)  // If the regressor was saved as --save_resume, then when testing we want to materialize the
                      // weights.
    sync_weights(all);
}